

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t init_decoder(aom_codec_alg_priv_t *ctx)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  long lVar2;
  aom_release_frame_buffer_cb_fn_t p_Var3;
  uint uVar4;
  int iVar5;
  AVxWorkerInterface *pAVar6;
  BufferPool *pBVar7;
  void *pvVar8;
  char *pcVar9;
  AVxWorker *memblk;
  undefined8 *memblk_00;
  AV1Decoder *pAVar10;
  
  pAVar6 = aom_get_worker_interface();
  ctx->last_show_frame = (RefCntBuffer *)0x0;
  ctx->need_resync = 1;
  ctx->flushed = 0;
  pBVar7 = (BufferPool *)aom_calloc(1,0x60);
  ctx->buffer_pool = pBVar7;
  if (pBVar7 != (BufferPool *)0x0) {
    pBVar7->num_frame_bufs = '\x10';
    pvVar8 = aom_calloc(0x10,0x58e0);
    __mutex = (pthread_mutex_t *)ctx->buffer_pool;
    *(void **)((long)__mutex + 0x40) = pvVar8;
    if (pvVar8 == (void *)0x0) {
      *(undefined1 *)((long)__mutex + 0x48) = 0;
      aom_free(__mutex);
      ctx->buffer_pool = (BufferPool *)0x0;
    }
    else {
      iVar5 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
      if (iVar5 == 0) {
        memblk = (AVxWorker *)aom_malloc(0x38);
        ctx->frame_worker = memblk;
        if (memblk == (AVxWorker *)0x0) {
          pcVar9 = "Failed to allocate frame_worker";
        }
        else {
          (*pAVar6->init)(memblk);
          memblk->thread_name = "aom frameworker";
          memblk_00 = (undefined8 *)aom_memalign(0x20,0x38);
          memblk->data1 = memblk_00;
          if (memblk_00 == (undefined8 *)0x0) {
            (*pAVar6->end)(memblk);
            aom_free(memblk);
            ctx->frame_worker = (AVxWorker *)0x0;
            pcVar9 = "Failed to allocate frame_worker_data";
          }
          else {
            pAVar10 = av1_decoder_create(ctx->buffer_pool);
            *memblk_00 = pAVar10;
            if (pAVar10 != (AV1Decoder *)0x0) {
              memblk_00[5] = 0;
              pAVar10->allow_lowbitdepth = (ctx->cfg).allow_lowbitdepth;
              pAVar10->max_threads = (ctx->cfg).threads;
              pAVar10->inv_tile_order = ctx->invert_tile_order;
              (pAVar10->common).tiles.large_scale = ctx->tile_mode;
              pAVar10->is_annexb = ctx->is_annexb;
              iVar5 = ctx->decode_tile_col;
              pAVar10->dec_tile_row = ctx->decode_tile_row;
              pAVar10->dec_tile_col = iVar5;
              pAVar10->operating_point = ctx->operating_point;
              pAVar10->output_all_layers = ctx->output_all_layers;
              uVar4 = ctx->row_mt;
              pAVar10->ext_tile_debug = ctx->ext_tile_debug;
              pAVar10->row_mt = uVar4;
              pAVar10->is_fwd_kf_present = 0;
              pAVar10->is_arf_frame_present = 0;
              memblk->hook = frame_worker_hook;
              lVar1 = *ctx->frame_worker->data1;
              lVar2 = *(long *)(lVar1 + 0x9e50);
              *(undefined8 *)(lVar1 + 0x3c48) = 0;
              *(int *)(lVar1 + 0x3d60) = ctx->byte_alignment;
              *(undefined8 *)(lVar1 + 0x5f724) = *(undefined8 *)&ctx->skip_loop_filter;
              if ((ctx->get_ext_fb_cb == (aom_get_frame_buffer_cb_fn_t)0x0) ||
                 (p_Var3 = ctx->release_ext_fb_cb, p_Var3 == (aom_release_frame_buffer_cb_fn_t)0x0))
              {
                *(code **)(lVar2 + 0x30) = av1_get_frame_buffer;
                *(code **)(lVar2 + 0x38) = av1_release_frame_buffer;
                iVar5 = av1_alloc_internal_frame_buffers((InternalFrameBufferList *)(lVar2 + 0x50));
                if (iVar5 != 0) {
                  aom_internal_error((aom_internal_error_info *)(lVar1 + 0x5ff08),
                                     AOM_CODEC_MEM_ERROR,
                                     "Failed to initialize internal frame buffers");
                }
                *(InternalFrameBufferList **)(lVar2 + 0x28) =
                     (InternalFrameBufferList *)(lVar2 + 0x50);
              }
              else {
                *(aom_get_frame_buffer_cb_fn_t *)(lVar2 + 0x30) = ctx->get_ext_fb_cb;
                *(aom_release_frame_buffer_cb_fn_t *)(lVar2 + 0x38) = p_Var3;
                *(void **)(lVar2 + 0x28) = ctx->ext_priv;
              }
              return AOM_CODEC_OK;
            }
            (*pAVar6->end)(memblk);
            aom_free(memblk_00);
            aom_free(memblk);
            ctx->frame_worker = (AVxWorker *)0x0;
            pcVar9 = "Failed to allocate frame_worker_data->pbi";
          }
        }
      }
      else {
        aom_free(ctx->buffer_pool->frame_bufs);
        pBVar7 = ctx->buffer_pool;
        pBVar7->frame_bufs = (RefCntBuffer *)0x0;
        pBVar7->num_frame_bufs = '\0';
        aom_free(pBVar7);
        ctx->buffer_pool = (BufferPool *)0x0;
        pcVar9 = "Failed to allocate buffer pool mutex";
      }
      (ctx->base).err_detail = pcVar9;
    }
  }
  return AOM_CODEC_MEM_ERROR;
}

Assistant:

static aom_codec_err_t init_decoder(aom_codec_alg_priv_t *ctx) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();

  ctx->last_show_frame = NULL;
  ctx->need_resync = 1;
  ctx->flushed = 0;

  ctx->buffer_pool = (BufferPool *)aom_calloc(1, sizeof(BufferPool));
  if (ctx->buffer_pool == NULL) return AOM_CODEC_MEM_ERROR;
  ctx->buffer_pool->num_frame_bufs = FRAME_BUFFERS;
  ctx->buffer_pool->frame_bufs = (RefCntBuffer *)aom_calloc(
      ctx->buffer_pool->num_frame_bufs, sizeof(*ctx->buffer_pool->frame_bufs));
  if (ctx->buffer_pool->frame_bufs == NULL) {
    ctx->buffer_pool->num_frame_bufs = 0;
    aom_free(ctx->buffer_pool);
    ctx->buffer_pool = NULL;
    return AOM_CODEC_MEM_ERROR;
  }

#if CONFIG_MULTITHREAD
  if (pthread_mutex_init(&ctx->buffer_pool->pool_mutex, NULL)) {
    aom_free(ctx->buffer_pool->frame_bufs);
    ctx->buffer_pool->frame_bufs = NULL;
    ctx->buffer_pool->num_frame_bufs = 0;
    aom_free(ctx->buffer_pool);
    ctx->buffer_pool = NULL;
    set_error_detail(ctx, "Failed to allocate buffer pool mutex");
    return AOM_CODEC_MEM_ERROR;
  }
#endif

  ctx->frame_worker = (AVxWorker *)aom_malloc(sizeof(*ctx->frame_worker));
  if (ctx->frame_worker == NULL) {
    set_error_detail(ctx, "Failed to allocate frame_worker");
    return AOM_CODEC_MEM_ERROR;
  }

  AVxWorker *const worker = ctx->frame_worker;
  winterface->init(worker);
  worker->thread_name = "aom frameworker";
  worker->data1 = aom_memalign(32, sizeof(FrameWorkerData));
  if (worker->data1 == NULL) {
    winterface->end(worker);
    aom_free(worker);
    ctx->frame_worker = NULL;
    set_error_detail(ctx, "Failed to allocate frame_worker_data");
    return AOM_CODEC_MEM_ERROR;
  }
  FrameWorkerData *frame_worker_data = (FrameWorkerData *)worker->data1;
  frame_worker_data->pbi = av1_decoder_create(ctx->buffer_pool);
  if (frame_worker_data->pbi == NULL) {
    winterface->end(worker);
    aom_free(frame_worker_data);
    aom_free(worker);
    ctx->frame_worker = NULL;
    set_error_detail(ctx, "Failed to allocate frame_worker_data->pbi");
    return AOM_CODEC_MEM_ERROR;
  }
  frame_worker_data->frame_context_ready = 0;
  frame_worker_data->received_frame = 0;
  frame_worker_data->pbi->allow_lowbitdepth = ctx->cfg.allow_lowbitdepth;

  // If decoding in serial mode, FrameWorker thread could create tile worker
  // thread or loopfilter thread.
  frame_worker_data->pbi->max_threads = ctx->cfg.threads;
  frame_worker_data->pbi->inv_tile_order = ctx->invert_tile_order;
  frame_worker_data->pbi->common.tiles.large_scale = ctx->tile_mode;
  frame_worker_data->pbi->is_annexb = ctx->is_annexb;
  frame_worker_data->pbi->dec_tile_row = ctx->decode_tile_row;
  frame_worker_data->pbi->dec_tile_col = ctx->decode_tile_col;
  frame_worker_data->pbi->operating_point = ctx->operating_point;
  frame_worker_data->pbi->output_all_layers = ctx->output_all_layers;
  frame_worker_data->pbi->ext_tile_debug = ctx->ext_tile_debug;
  frame_worker_data->pbi->row_mt = ctx->row_mt;
  frame_worker_data->pbi->is_fwd_kf_present = 0;
  frame_worker_data->pbi->is_arf_frame_present = 0;
  worker->hook = frame_worker_hook;

  init_buffer_callbacks(ctx);

  return AOM_CODEC_OK;
}